

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O2

int frame_is_kf_gf_arf(AV1_COMP *cpi)

{
  return (int)(((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) == 2 ||
              ((cpi->common).current_frame.frame_type & 0xfd) == 0);
}

Assistant:

static inline int frame_is_kf_gf_arf(const AV1_COMP *cpi) {
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const FRAME_UPDATE_TYPE update_type =
      gf_group->update_type[cpi->gf_frame_index];

  return frame_is_intra_only(&cpi->common) || update_type == ARF_UPDATE ||
         update_type == GF_UPDATE;
}